

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.pb.cc
# Opt level: O1

DoubleValue *
google::protobuf::Arena::CreateMaybeMessage<google::protobuf::DoubleValue>(Arena *arena)

{
  DoubleValue *this;
  
  if (arena == (Arena *)0x0) {
    this = (DoubleValue *)operator_new(0x20);
    (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = (void *)0x0;
    this->value_ = 0.0;
    (this->super_Message).super_MessageLite._vptr_MessageLite =
         (_func_int **)&PTR__DoubleValue_003c9788;
    (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  }
  else {
    if (arena->hooks_cookie_ != (void *)0x0) {
      OnArenaAllocation(arena,(type_info *)&DoubleValue::typeinfo,0x20);
    }
    this = (DoubleValue *)AllocateAlignedNoHook(arena,0x20);
    DoubleValue::DoubleValue(this,arena);
  }
  return this;
}

Assistant:

PROTOBUF_NOINLINE PROTOBUF_NAMESPACE_ID::FloatValue* Arena::CreateMaybeMessage< PROTOBUF_NAMESPACE_ID::FloatValue >(Arena* arena) {
  return Arena::CreateMessageInternal< PROTOBUF_NAMESPACE_ID::FloatValue >(arena);
}